

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O1

int testGetFullTerritoryName(void)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  TerritoryAlphabets *pTVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  Territory TVar10;
  char s [8];
  char expectedLocalName [112];
  char territoryName [1135];
  int local_538;
  uint local_530;
  uint local_52c;
  char local_520 [8];
  char local_518 [112];
  char local_4a8 [1144];
  
  testGetFullTerritoryNameInLocale("Sancta Sedes",TERRITORY_VAT,0,(char *)0x0);
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"E");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"EN");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"??");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"-");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"_");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"_EN");
  local_538 = 0x10;
  lVar7 = 0;
  local_530 = 0;
  local_52c = 0;
  do {
    pcVar6 = testGetFullTerritoryName::locales_to_test[lVar7];
    TVar10 = TERRITORY_VAT;
    do {
      iVar9 = 0;
      getFullTerritoryNameInLocaleUtf8(local_518,TVar10,0,(char *)0x0);
      testGetFullTerritoryNameInLocale(local_518,TVar10,0,(char *)0x0);
      testGetFullTerritoryNameInLocale("",TVar10,-1,pcVar6);
      testGetFullTerritoryNameInLocale("",TVar10,999,pcVar6);
      local_538 = local_538 + 6;
      do {
        iVar1 = getFullTerritoryNameInLocaleUtf8(local_4a8,TVar10,iVar9,pcVar6);
        uVar2 = local_530;
        if (iVar1 != 0) {
          sVar3 = strlen(local_4a8);
          uVar2 = (uint)sVar3;
          if (uVar2 - 0x70 < 0xffffff91) {
            pthread_mutex_lock((pthread_mutex_t *)&mutex);
            nrErrors = nrErrors + 1;
            pthread_mutex_unlock((pthread_mutex_t *)&mutex);
            pcVar4 = getTerritoryIsoName(local_520,TVar10,0);
            printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",pcVar6
                   ,pcVar4,sVar3 & 0xffffffff,0x6f,local_4a8);
          }
          local_52c = local_52c + 1;
          local_538 = local_538 + 1;
          if ((int)uVar2 < (int)local_530) {
            uVar2 = local_530;
          }
        }
        local_530 = uVar2;
        iVar9 = iVar9 + 1;
      } while (iVar1 != 0);
      TVar10 = TVar10 + 1;
    } while (TVar10 != _TERRITORY_MAX);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1b);
  TVar10 = TERRITORY_VAT;
  do {
    pTVar5 = getAlphabetsForTerritory(TVar10);
    iVar9 = local_538;
    if (0 < pTVar5->count) {
      lVar7 = 0;
      do {
        iVar9 = getFullTerritoryNameLocalInAlphabetUtf8(local_4a8,TVar10,0,pTVar5->alphabet[lVar7]);
        if (iVar9 == 0) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          pcVar6 = getTerritoryIsoName(local_518,TVar10,0);
          printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n"
                 ,pcVar6,(ulong)(uint)pTVar5->alphabet[0]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pTVar5->count);
      iVar9 = local_538 + (int)lVar7;
    }
    pTVar5 = getAlphabetsForTerritory(TVar10);
    if (0 < pTVar5->count) {
      uVar8 = 0;
      do {
        iVar1 = getFullTerritoryNameLocalInAlphabetUtf8(local_4a8,TVar10,0,pTVar5->alphabet[uVar8]);
        if (iVar1 == 0) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          pcVar6 = getTerritoryIsoName(local_518,TVar10,0);
          printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n"
                 ,pcVar6,(ulong)(uint)pTVar5->alphabet[uVar8]);
        }
        iVar1 = getFullTerritoryNameLocalUtf8(local_518,TVar10,(int)uVar8);
        if ((iVar1 == 0) || (iVar1 = strcmp(local_4a8,local_518), iVar1 != 0)) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n"
                 ,local_4a8,uVar8 & 0xffffffff,local_518);
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)pTVar5->count);
    }
    local_538 = iVar9 + 1;
    TVar10 = TVar10 + 1;
  } while (TVar10 != _TERRITORY_MAX);
  printf("%d territory names, max length %d characters\n",(ulong)local_52c,(ulong)local_530);
  testGetFullTerritoryNameInLocale("Netherlands",TERRITORY_NLD,0,"en_US");
  testGetFullTerritoryNameInLocale("The Netherlands",TERRITORY_NLD,1,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_NLD,2,"en_US");
  testGetFullTerritoryNameInLocale("Russia",TERRITORY_RUS,0,"en_US");
  testGetFullTerritoryNameInLocale("Russian Federation",TERRITORY_RUS,1,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_RUS,2,"en_US");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_3d645 + 0x1d,TERRITORY_KAZ,0,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_KAZ,1,"en_US");
  testGetFullTerritoryNameInLocale("Turkmenistan",TERRITORY_TKM,0,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_TKM,1,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_TKM,2,"en_US");
  testGetFullTerritoryNameInLocale("",TERRITORY_TKM,999,"en_US");
  testGetFullTerritoryNameInLocale("Nederland",TERRITORY_NLD,0,"nl");
  testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"nl");
  testGetFullTerritoryNameInLocale("Vaticaanstad",TERRITORY_VAT,0,"nl");
  testGetFullTerritoryNameInLocale("Heilige Stoel",TERRITORY_VAT,1,"nl");
  testGetFullTerritoryNameInLocale("",TERRITORY_VAT,2,"nl");
  testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"nl");
  testGetFullTerritoryNameInLocale("Pays-Bas",TERRITORY_NLD,0,"fr");
  testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"fr");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93 + 9,TERRITORY_VAT,0,"fr");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_f93,TERRITORY_VAT,1,"fr");
  testGetFullTerritoryNameInLocale(anon_var_dwarf_46d9c + 0x19,TERRITORY_VAT,2,"fr");
  testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"fr");
  testGetFullTerritoryNameLocal("Nederland",TERRITORY_NLD,0);
  testGetFullTerritoryNameLocal("",TERRITORY_NLD,1);
  testGetFullTerritoryNameLocalInAlphabet("Nederland",TERRITORY_NLD,0,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,1,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,ALPHABET_GREEK);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MIN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MAX);
  testGetFullTerritoryNameLocal(anon_var_dwarf_fb5,TERRITORY_RUS,0);
  testGetFullTerritoryNameLocal("",TERRITORY_RUS,1);
  testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_fb5,TERRITORY_RUS,0,ALPHABET_CYRILLIC);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_GREEK);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MIN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MAX);
  testGetFullTerritoryNameLocal(anon_var_dwarf_fcc,TERRITORY_KAZ,0);
  testGetFullTerritoryNameLocal("Qazaqstan",TERRITORY_KAZ,1);
  testGetFullTerritoryNameLocal(anon_var_dwarf_3d645 + 0x1d,TERRITORY_KAZ,2);
  testGetFullTerritoryNameLocal("",TERRITORY_KAZ,3);
  testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_fcc,TERRITORY_KAZ,0,ALPHABET_CYRILLIC);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,1,ALPHABET_CYRILLIC);
  testGetFullTerritoryNameLocalInAlphabet("Qazaqstan",TERRITORY_KAZ,0,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet
            (anon_var_dwarf_3d645 + 0x1d,TERRITORY_KAZ,1,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,2,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
  testGetFullTerritoryNameLocal(anon_var_dwarf_fe2,TERRITORY_TKM,0);
  testGetFullTerritoryNameLocal(anon_var_dwarf_ff9,TERRITORY_TKM,1);
  testGetFullTerritoryNameLocal(anon_var_dwarf_3d287 + 0x27,TERRITORY_TKM,2);
  testGetFullTerritoryNameLocal("",TERRITORY_TKM,3);
  testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_ff9,TERRITORY_TKM,0,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ROMAN);
  testGetFullTerritoryNameLocalInAlphabet(anon_var_dwarf_fe2,TERRITORY_TKM,0,ALPHABET_CYRILLIC);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_CYRILLIC);
  testGetFullTerritoryNameLocalInAlphabet
            (anon_var_dwarf_3d287 + 0x27,TERRITORY_TKM,0,ALPHABET_ARABIC);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ARABIC);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
  testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
  return iVar9 + 0x7f;
}

Assistant:

int testGetFullTerritoryName(void) {
    int nrTests = 0;
    enum Territory territory;
    int nrNames = 0;
    int maxLength = 0;
    int alternative;
    int i;
    const TerritoryAlphabets *territoryAlphabets;
    char territoryName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1024]; // large so we can test overflow
    static const char *locales_to_test[] = {
            "AF", "AR", "BE", "CN", "CS", "DA", "DE", "EN", "FI", "ES", "FR", "HE", "HI",
            "HR", "ID", "IT", "JA", "KO", "NL", "NO", "PL", "PT", "RU", "SV", "SW", "TR", "UK"};

    nrTests += testGetFullTerritoryNameInLocale("Sancta Sedes", TERRITORY_VAT, 0, NULL);    // Local name.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "");           // Wrong locale -> fallback language.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "E");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "EN");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "??");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "-");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_EN");

    for (i = 0; i < (int) (sizeof(locales_to_test) / sizeof(locales_to_test[0])); i++) {
        const char *locale = locales_to_test[i];
        int nrInLocale = 0;
        for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
            char expectedLocalName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            getFullTerritoryNameInLocaleUtf8(expectedLocalName, territory, 0, 0);

            nrTests += testGetFullTerritoryNameInLocale(expectedLocalName, territory, 0, NULL);
            nrTests += testGetFullTerritoryNameInLocale("", territory, -1, locale);
            nrTests += testGetFullTerritoryNameInLocale("", territory, 999, locale);
            for (alternative = 0;; alternative++) {
                int len;
                if (!getFullTerritoryNameInLocaleUtf8(territoryName, territory, alternative, locale)) {
                    break;
                }
                ++nrInLocale;
                ++nrNames;
                len = (int) strlen(territoryName);
                nrTests++;
                if (len < 1 || len > MAX_TERRITORY_FULLNAME_UTF8_LEN) {
                    char s[MAX_ISOCODE_ASCII_LEN + 1];
                    foundError();
                    printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",
                           locale, getTerritoryIsoName(s, territory, 0), len,
                           MAX_TERRITORY_FULLNAME_UTF8_LEN, territoryName);
                }
                if (len > maxLength) {
                    maxLength = len;
                }
            }
        }
    }

    // check that every territory has a local name in all the common alphabets
    for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            nrTests++;
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0,
                                                         territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[0]);
            }
        }

        // check that the x-th local name is in the x-th common alphabet
        nrTests++;
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            char territoryNameLocal[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0, territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[i]);
            }
            if (!getFullTerritoryNameLocalUtf8(territoryNameLocal, territory, i) ||
                strcmp(territoryName, territoryNameLocal)) {
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n",
                       territoryName, i, territoryNameLocal);
            }
        }
    }
    printf("%d territory names, max length %d characters\n", nrNames, maxLength);

    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("The Netherlands", TERRITORY_NLD, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russia", TERRITORY_RUS, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russian Federation", TERRITORY_RUS, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_RUS, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Kazakhstan", TERRITORY_KAZ, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_KAZ, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Turkmenistan", TERRITORY_TKM, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 999, "en_US");

#ifdef MAPCODE_SUPPORT_LANGUAGE_NL
    nrTests += testGetFullTerritoryNameInLocale("Nederland", TERRITORY_NLD, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Vaticaanstad", TERRITORY_VAT, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Heilige Stoel", TERRITORY_VAT, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 2, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "nl");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "nl");
#endif

#ifdef MAPCODE_SUPPORT_LANGUAGE_FR
    nrTests += testGetFullTerritoryNameInLocale("Pays-Bas", TERRITORY_NLD, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Cit\xC3\xA9 du Vatican", TERRITORY_VAT, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Saint-Si\xC3\xA8ge", TERRITORY_VAT, 2, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "fr");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "fr");
#endif

    nrTests += testGetFullTerritoryNameLocal("Nederland", TERRITORY_NLD, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_NLD, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Nederland", TERRITORY_NLD, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Росси́я", TERRITORY_RUS, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_RUS, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Росси́я", TERRITORY_RUS, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Қазақстан", TERRITORY_KAZ, 0);
    nrTests += testGetFullTerritoryNameLocal("Qazaqstan", TERRITORY_KAZ, 1);
    nrTests += testGetFullTerritoryNameLocal("Kazakhstan", TERRITORY_KAZ, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_KAZ, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Қазақстан", TERRITORY_KAZ, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Qazaqstan", TERRITORY_KAZ, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Kazakhstan", TERRITORY_KAZ, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 2, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Түркменистан", TERRITORY_TKM, 0);
    nrTests += testGetFullTerritoryNameLocal("Türkmenistan", TERRITORY_TKM, 1);
    nrTests += testGetFullTerritoryNameLocal("تۆركمنيستآن", TERRITORY_TKM, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_TKM, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Türkmenistan", TERRITORY_TKM, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Түркменистан", TERRITORY_TKM, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("تۆركمنيستآن", TERRITORY_TKM, 0, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);

    return nrTests;
}